

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

return_type
flatbuffers::IndirectHelper<flatbuffers::Offset<flatbuffers::String>_>::Read
          (uint8_t *p,offset_type i)

{
  uint uVar1;
  uint8_t *offset_location;
  offset_type i_local;
  uint8_t *p_local;
  
  uVar1 = ReadScalar<unsigned_int>(p + (i << 2));
  return (return_type)(p + (i << 2) + uVar1);
}

Assistant:

static return_type Read(const uint8_t *const p, const offset_type i) {
    // Offsets are relative to themselves, so first update the pointer to
    // point to the offset location.
    const uint8_t *const offset_location = p + i * element_stride;

    // Then read the scalar value of the offset (which may be 32 or 64-bits) and
    // then determine the relative location from the offset location.
    return reinterpret_cast<return_type>(
        offset_location + ReadScalar<offset_type>(offset_location));
  }